

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xchacha20.cpp
# Opt level: O2

void __thiscall crypto::xchacha20::update(xchacha20 *this)

{
  word *pwVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t i;
  long lVar9;
  
  uVar2 = *(undefined8 *)this->state;
  uVar3 = *(undefined8 *)(this->state + 2);
  uVar4 = *(undefined8 *)(this->state + 4);
  uVar5 = *(undefined8 *)(this->state + 6);
  uVar6 = *(undefined8 *)(this->state + 8);
  uVar7 = *(undefined8 *)(this->state + 10);
  uVar8 = *(undefined8 *)(this->state + 0xe);
  *(undefined8 *)(this->keystream + 0xc) = *(undefined8 *)(this->state + 0xc);
  *(undefined8 *)(this->keystream + 0xe) = uVar8;
  *(undefined8 *)(this->keystream + 8) = uVar6;
  *(undefined8 *)(this->keystream + 10) = uVar7;
  *(undefined8 *)(this->keystream + 4) = uVar4;
  *(undefined8 *)(this->keystream + 6) = uVar5;
  *(undefined8 *)this->keystream = uVar2;
  *(undefined8 *)(this->keystream + 2) = uVar3;
  run_rounds(this->keystream);
  for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
    pwVar1 = this->keystream + lVar9;
    *pwVar1 = *pwVar1 + this->state[lVar9];
  }
  *(long *)(this->state + 0xc) = *(long *)(this->state + 0xc) + 1;
  return;
}

Assistant:

void xchacha20::update() {
	
	std::memcpy(keystream, state, sizeof(state));
	run_rounds(keystream);
	
	for(size_t i = 0; i < 16; i++) {
		keystream[i] += state[i];
	}
	
	increment_count(state);
	
}